

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

void tcptran_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if (*(char *)((long)arg + 0x3a) == '\x01') {
    nni_mtx_unlock((nni_mtx *)arg);
    result = NNG_ECLOSED;
  }
  else {
    if (*(long *)((long)arg + 0x48) == 0) {
      _Var1 = nni_aio_start(aio,tcptran_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x48) = aio;
        if (*(char *)((long)arg + 0x39) == '\0') {
          *(undefined1 *)((long)arg + 0x39) = 1;
          nng_stream_listener_accept
                    (*(nng_stream_listener **)((long)arg + 0x418),(nng_aio *)((long)arg + 0x50));
        }
        else {
          tcptran_ep_match((tcptran_ep *)arg);
        }
      }
      nni_mtx_unlock((nni_mtx *)arg);
      return;
    }
    nni_mtx_unlock((nni_mtx *)arg);
    result = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
tcptran_ep_accept(void *arg, nni_aio *aio)
{
	tcptran_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->useraio != NULL) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}
	if (!nni_aio_start(aio, tcptran_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->useraio = aio;
	if (!ep->started) {
		ep->started = true;
		nng_stream_listener_accept(ep->listener, &ep->connaio);
	} else {
		tcptran_ep_match(ep);
	}
	nni_mtx_unlock(&ep->mtx);
}